

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkview.c
# Opt level: O1

_Bool XPKView_CreateCheckerboardPattern(void)

{
  uint8_t *puVar1;
  int y;
  int iVar2;
  int iVar3;
  long lVar4;
  
  puVar1 = (uint8_t *)calloc(4,0x400);
  app.checkerboard_rgba = puVar1;
  if (puVar1 == (uint8_t *)0x0) {
    LPWarn("xpkview","couldn\'t malloc the checkerboard!");
  }
  else {
    iVar2 = 0;
    lVar4 = 0;
    do {
      iVar3 = (int)lVar4;
      lVar4 = 0;
      do {
        app.checkerboard_rgba[lVar4 + iVar3] = 0xff;
        app.checkerboard_rgba[lVar4 + 1 + (long)iVar3] = 0xff;
        app.checkerboard_rgba[lVar4 + 2 + (long)iVar3] = 0xff;
        app.checkerboard_rgba[lVar4 + 3 + (long)iVar3] = 0xff;
        lVar4 = lVar4 + 4;
      } while ((int)lVar4 != 0x40);
      lVar4 = (long)(iVar3 + 0x40);
      iVar3 = 0x10;
      do {
        app.checkerboard_rgba[lVar4] = 0xf0;
        app.checkerboard_rgba[lVar4 + 1] = 0xf0;
        app.checkerboard_rgba[lVar4 + 2] = 0xf0;
        app.checkerboard_rgba[lVar4 + 3] = 0xf0;
        lVar4 = lVar4 + 4;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x10);
    iVar2 = 0;
    do {
      iVar3 = (int)lVar4;
      lVar4 = 0;
      do {
        app.checkerboard_rgba[lVar4 + iVar3] = 0xf0;
        app.checkerboard_rgba[lVar4 + 1 + (long)iVar3] = 0xf0;
        app.checkerboard_rgba[lVar4 + 2 + (long)iVar3] = 0xf0;
        app.checkerboard_rgba[lVar4 + 3 + (long)iVar3] = 0xf0;
        lVar4 = lVar4 + 4;
      } while ((int)lVar4 != 0x40);
      lVar4 = (long)(iVar3 + 0x40);
      iVar3 = 0x10;
      do {
        app.checkerboard_rgba[lVar4] = 0xff;
        app.checkerboard_rgba[lVar4 + 1] = 0xff;
        app.checkerboard_rgba[lVar4 + 2] = 0xff;
        app.checkerboard_rgba[lVar4 + 3] = 0xff;
        lVar4 = lVar4 + 4;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x10);
  }
  return puVar1 != (uint8_t *)0x0;
}

Assistant:

static bool
XPKView_CreateCheckerboardPattern(void)
{
	int checker_w = 16;
	int checker_h = 16;
	SDL_Color white = (SDL_Color){255, 255, 255, 255};
	SDL_Color gray = (SDL_Color){240, 240, 240, 240};

	app.checkerboard_rgba = calloc(4, checker_w*checker_h*4);

	if (!app.checkerboard_rgba) {
		LPWarn(MSGPREFIX, "couldn't malloc the checkerboard!");
		return false;
	}

	int i = 0;

	/* Top row: WHITE, GRAY */
	for (int y = 0; y < checker_h; y++) {
		for (int x = 0; x < checker_w; x++) {
			app.checkerboard_rgba[i++] = white.r;
			app.checkerboard_rgba[i++] = white.g;
			app.checkerboard_rgba[i++] = white.b;
			app.checkerboard_rgba[i++] = white.a;
		}

		for (int x = 0; x < checker_w; x++) {
			app.checkerboard_rgba[i++] = gray.r;
			app.checkerboard_rgba[i++] = gray.g;
			app.checkerboard_rgba[i++] = gray.b;
			app.checkerboard_rgba[i++] = gray.a;
		}
	}

	/* Bottom row: GRAY, WHITE */
	for (int y = 0; y < checker_h; y++) {
		for (int x = 0; x < checker_w; x++) {
			app.checkerboard_rgba[i++] = gray.r;
			app.checkerboard_rgba[i++] = gray.g;
			app.checkerboard_rgba[i++] = gray.b;
			app.checkerboard_rgba[i++] = gray.a;
		}

		for (int x = 0; x < checker_w; x++) {
			app.checkerboard_rgba[i++] = white.r;
			app.checkerboard_rgba[i++] = white.g;
			app.checkerboard_rgba[i++] = white.b;
			app.checkerboard_rgba[i++] = white.a;
		}
	}

	return true;
}